

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void solve_l2r_l1l2_svr(problem *prob,double *w,parameter *param,int solver_type)

{
  double dVar1;
  undefined4 uVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  feature_node *pfVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  feature_node *pfVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double local_b8;
  double local_88;
  
  uVar19 = prob->l;
  uVar15 = (ulong)(int)uVar19;
  dVar23 = param->eps;
  local_88 = param->C;
  dVar1 = param->p;
  uVar18 = prob->n;
  uVar9 = uVar15 * 4;
  if ((long)uVar15 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar11 = uVar15 * 8;
  if ((long)uVar15 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar9);
  pvVar7 = operator_new__(uVar11);
  pvVar8 = operator_new__(uVar11);
  dVar31 = 0.0;
  if (solver_type != 0xd) {
    dVar31 = 0.5 / local_88;
  }
  pdVar4 = prob->y;
  uVar9 = 0;
  uVar11 = 0;
  if (0 < (int)uVar19) {
    uVar11 = (ulong)uVar19;
  }
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    *(undefined8 *)((long)pvVar7 + uVar9 * 8) = 0;
  }
  uVar10 = 0;
  uVar9 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    w[uVar10] = 0.0;
  }
  for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
    *(undefined8 *)((long)pvVar8 + uVar10 * 8) = 0;
    dVar22 = 0.0;
    for (pfVar12 = prob->x[uVar10]; lVar13 = (long)pfVar12->index, lVar13 != -1;
        pfVar12 = pfVar12 + 1) {
      dVar32 = pfVar12->value;
      dVar22 = dVar22 + dVar32 * dVar32;
      *(double *)((long)pvVar8 + uVar10 * 8) = dVar22;
      w[lVar13 + -1] = dVar32 * *(double *)((long)pvVar7 + uVar10 * 8) + w[lVar13 + -1];
    }
    *(int *)((long)pvVar6 + uVar10 * 4) = (int)uVar10;
  }
  if (solver_type != 0xd) {
    local_88 = INFINITY;
  }
  uVar24 = 0;
  uVar25 = 0xbff00000;
  local_b8 = INFINITY;
  uVar18 = 0;
  uVar10 = (ulong)uVar19;
  while (uVar18 != 1000) {
    uVar20 = 0;
    if (0 < (int)uVar10) {
      uVar20 = uVar10 & 0xffffffff;
    }
    uVar16 = uVar10;
    for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
      iVar5 = rand();
      lVar13 = (long)(iVar5 % (int)uVar16) + uVar21;
      uVar2 = *(undefined4 *)((long)pvVar6 + uVar21 * 4);
      *(undefined4 *)((long)pvVar6 + uVar21 * 4) = *(undefined4 *)((long)pvVar6 + lVar13 * 4);
      *(undefined4 *)((long)pvVar6 + lVar13 * 4) = uVar2;
      uVar16 = (ulong)((int)uVar16 - 1);
    }
    dVar32 = 0.0;
    dVar22 = 0.0;
    uVar10 = uVar10 & 0xffffffff;
    for (iVar5 = 0; uVar14 = (uint)uVar10, iVar5 < (int)uVar14; iVar5 = iVar5 + 1) {
      iVar3 = *(int *)((long)pvVar6 + (long)iVar5 * 4);
      lVar13 = (long)iVar3;
      dVar27 = *(double *)((long)pvVar7 + lVar13 * 8);
      dVar28 = dVar31 * dVar27 - pdVar4[lVar13];
      pfVar12 = prob->x[lVar13];
      for (pfVar17 = pfVar12; (long)pfVar17->index != -1; pfVar17 = pfVar17 + 1) {
        dVar28 = dVar28 + pfVar17->value * w[(long)pfVar17->index + -1];
      }
      dVar26 = dVar1 + dVar28;
      dVar28 = dVar28 - dVar1;
      if ((dVar27 != 0.0) || (NAN(dVar27))) {
        if (dVar27 < local_88) {
          if (dVar27 <= -local_88) {
            dVar30 = dVar28;
            if (dVar28 < 0.0) goto LAB_001097aa;
            dVar30 = 0.0;
            if (local_b8 < dVar28) goto LAB_001098fc;
          }
          else {
            dVar30 = dVar28;
            if (0.0 < dVar27) {
              dVar30 = dVar26;
            }
            dVar30 = ABS(dVar30);
          }
        }
        else {
          dVar30 = dVar26;
          if ((dVar26 <= 0.0) && (dVar30 = 0.0, dVar26 < -local_b8)) goto LAB_001098fc;
        }
LAB_00109832:
        dVar29 = *(double *)((long)pvVar8 + lVar13 * 8) + dVar31;
        if (dVar27 * dVar29 <= dVar26) {
          if (dVar28 <= dVar27 * dVar29) {
            dVar29 = -dVar27;
          }
          else {
            dVar29 = -dVar28 / dVar29;
          }
        }
        else {
          dVar29 = -dVar26 / dVar29;
        }
        if (dVar22 <= dVar30) {
          dVar22 = dVar30;
        }
        dVar32 = dVar32 + dVar30;
        if (1e-12 <= ABS(dVar29)) {
          dVar28 = dVar29 + dVar27;
          if (dVar29 + dVar27 <= -local_88) {
            dVar28 = -local_88;
          }
          if (local_88 <= dVar28) {
            dVar28 = local_88;
          }
          *(double *)((long)pvVar7 + lVar13 * 8) = dVar28;
          dVar28 = dVar28 - dVar27;
          if ((dVar28 != 0.0) || (NAN(dVar28))) {
            for (; lVar13 = (long)pfVar12->index, lVar13 != -1; pfVar12 = pfVar12 + 1) {
              w[lVar13 + -1] = pfVar12->value * dVar28 + w[lVar13 + -1];
            }
          }
        }
      }
      else {
        dVar30 = dVar26;
        if (dVar26 < 0.0) {
LAB_001097aa:
          dVar30 = -dVar30;
          goto LAB_00109832;
        }
        dVar30 = dVar28;
        if (((0.0 < dVar28) || (dVar30 = 0.0, dVar26 <= local_b8)) || (-local_b8 <= dVar28))
        goto LAB_00109832;
LAB_001098fc:
        uVar10 = (ulong)(uVar14 - 1);
        *(undefined4 *)((long)pvVar6 + (long)iVar5 * 4) =
             *(undefined4 *)((long)pvVar6 + (long)(int)uVar14 * 4 + -4);
        *(int *)((long)pvVar6 + (long)(int)uVar14 * 4 + -4) = iVar3;
        iVar5 = iVar5 + -1;
      }
    }
    dVar27 = dVar32;
    if (uVar18 != 0) {
      dVar27 = (double)CONCAT44(uVar25,uVar24);
    }
    uVar18 = uVar18 + 1;
    if (uVar18 % 10 == 0) {
      info(".");
    }
    uVar24 = SUB84(dVar27,0);
    uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
    local_b8 = dVar22;
    if (dVar32 <= dVar23 * dVar27) {
      if (uVar14 == uVar19) goto LAB_001099e2;
      info("*");
      local_b8 = INFINITY;
      uVar10 = uVar15;
    }
  }
  uVar18 = 1000;
LAB_001099e2:
  info("\noptimization finished, #iter = %d\n",(ulong)uVar18);
  if (999 < (int)uVar18) {
    info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");
  }
  dVar23 = 0.0;
  for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
    dVar23 = dVar23 + w[uVar15] * w[uVar15];
  }
  dVar23 = dVar23 * 0.5;
  uVar19 = 0;
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    dVar22 = *(double *)((long)pvVar7 + uVar9 * 8);
    dVar23 = dVar23 + dVar31 * 0.5 * dVar22 * dVar22 +
                      (ABS(dVar22) * dVar1 - pdVar4[uVar9] * dVar22);
    uVar19 = uVar19 + (dVar22 != 0.0);
  }
  info("Objective value = %lf\n",dVar23);
  info("nSV = %d\n",(ulong)uVar19);
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  operator_delete__(pvVar6);
  return;
}

Assistant:

static void solve_l2r_l1l2_svr(
	const problem *prob, double *w, const parameter *param,
	int solver_type)
{
	int l = prob->l;
	double C = param->C;
	double p = param->p;
	int w_size = prob->n;
	double eps = param->eps;
	int i, s, iter = 0;
	int max_iter = 1000;
	int active_size = l;
	int *index = new int[l];

	double d, G, H;
	double Gmax_old = INF;
	double Gmax_new, Gnorm1_new;
	double Gnorm1_init = -1.0; // Gnorm1_init is initialized at the first iteration
	double *beta = new double[l];
	double *QD = new double[l];
	double *y = prob->y;

	// L2R_L2LOSS_SVR_DUAL
	double lambda[1], upper_bound[1];
	lambda[0] = 0.5/C;
	upper_bound[0] = INF;

	if(solver_type == L2R_L1LOSS_SVR_DUAL)
	{
		lambda[0] = 0;
		upper_bound[0] = C;
	}

	// Initial beta can be set here. Note that
	// -upper_bound <= beta[i] <= upper_bound
	for(i=0; i<l; i++)
		beta[i] = 0;

	for(i=0; i<w_size; i++)
		w[i] = 0;
	for(i=0; i<l; i++)
	{
		QD[i] = 0;
		feature_node *xi = prob->x[i];
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;
			w[xi->index-1] += beta[i]*val;
			xi++;
		}

		index[i] = i;
	}


	while(iter < max_iter)
	{
		Gmax_new = 0;
		Gnorm1_new = 0;

		for(i=0; i<active_size; i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}

		for(s=0; s<active_size; s++)
		{
			i = index[s];
			G = -y[i] + lambda[GETI(i)]*beta[i];
			H = QD[i] + lambda[GETI(i)];

			feature_node *xi = prob->x[i];
			while(xi->index != -1)
			{
				int ind = xi->index-1;
				double val = xi->value;
				G += val*w[ind];
				xi++;
			}

			double Gp = G+p;
			double Gn = G-p;
			double violation = 0;
			if(beta[i] == 0)
			{
				if(Gp < 0)
					violation = -Gp;
				else if(Gn > 0)
					violation = Gn;
				else if(Gp>Gmax_old && Gn<-Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] >= upper_bound[GETI(i)])
			{
				if(Gp > 0)
					violation = Gp;
				else if(Gp < -Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] <= -upper_bound[GETI(i)])
			{
				if(Gn < 0)
					violation = -Gn;
				else if(Gn > Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] > 0)
				violation = fabs(Gp);
			else
				violation = fabs(Gn);

			Gmax_new = max(Gmax_new, violation);
			Gnorm1_new += violation;

			// obtain Newton direction d
			if(Gp < H*beta[i])
				d = -Gp/H;
			else if(Gn > H*beta[i])
				d = -Gn/H;
			else
				d = -beta[i];

			if(fabs(d) < 1.0e-12)
				continue;

			double beta_old = beta[i];
			beta[i] = min(max(beta[i]+d, -upper_bound[GETI(i)]), upper_bound[GETI(i)]);
			d = beta[i]-beta_old;

			if(d != 0)
			{
				xi = prob->x[i];
				while(xi->index != -1)
				{
					w[xi->index-1] += d*xi->value;
					xi++;
				}
			}
		}

		if(iter == 0)
			Gnorm1_init = Gnorm1_new;
		iter++;
		if(iter % 10 == 0)
			info(".");

		if(Gnorm1_new <= eps*Gnorm1_init)
		{
			if(active_size == l)
				break;
			else
			{
				active_size = l;
				info("*");
				Gmax_old = INF;
				continue;
			}
		}

		Gmax_old = Gmax_new;
	}

	info("\noptimization finished, #iter = %d\n", iter);
	if(iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0; i<w_size; i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0; i<l; i++)
	{
		v += p*fabs(beta[i]) - y[i]*beta[i] + 0.5*lambda[GETI(i)]*beta[i]*beta[i];
		if(beta[i] != 0)
			nSV++;
	}

	info("Objective value = %lf\n", v);
	info("nSV = %d\n",nSV);

	delete [] beta;
	delete [] QD;
	delete [] index;
}